

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetFocusID(ImGuiID id,ImGuiWindow *window)

{
  ImGuiNavLayer IVar1;
  ImGuiContext *pIVar2;
  ImRect IVar3;
  
  pIVar2 = GImGui;
  if (GImGui->NavWindow != window) {
    SetNavWindow(window);
  }
  IVar1 = (window->DC).NavLayerCurrent;
  pIVar2->NavId = id;
  pIVar2->NavLayer = IVar1;
  pIVar2->NavFocusScopeId = pIVar2->CurrentFocusScopeId;
  window->NavLastIds[IVar1] = id;
  if ((pIVar2->LastItemData).ID == id) {
    IVar3 = WindowRectAbsToRel(window,&(pIVar2->LastItemData).NavRect);
    window->NavRectRel[IVar1] = IVar3;
  }
  if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
    pIVar2->NavDisableMouseHover = true;
  }
  else {
    pIVar2->NavDisableHighlight = true;
  }
  return;
}

Assistant:

void ImGui::SetFocusID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    if (g.NavWindow != window)
       SetNavWindow(window);

    // Assume that SetFocusID() is called in the context where its window->DC.NavLayerCurrent and g.CurrentFocusScopeId are valid.
    // Note that window may be != g.CurrentWindow (e.g. SetFocusID call in InputTextEx for multi-line text)
    const ImGuiNavLayer nav_layer = window->DC.NavLayerCurrent;
    g.NavId = id;
    g.NavLayer = nav_layer;
    g.NavFocusScopeId = g.CurrentFocusScopeId;
    window->NavLastIds[nav_layer] = id;
    if (g.LastItemData.ID == id)
        window->NavRectRel[nav_layer] = WindowRectAbsToRel(window, g.LastItemData.NavRect);

    if (g.ActiveIdSource == ImGuiInputSource_Nav)
        g.NavDisableMouseHover = true;
    else
        g.NavDisableHighlight = true;
}